

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  int iVar1;
  long lVar2;
  _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *this_01;
  _Base_ptr p_Var3;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    this_00 = &(this->levels_[lVar4].added_files)->_M_t;
    to_unref.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_unref.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    to_unref.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &to_unref.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ,(this_00->_M_impl).super__Rb_tree_header._M_node_count);
    for (p_Var3 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this_00->_M_impl).super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 &to_unref.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ,(value_type *)(p_Var3 + 1));
    }
    std::
    _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::~_Rb_tree(this_00);
    operator_delete(this_00,0x30);
    uVar5 = 0;
    while( true ) {
      if ((ulong)((long)to_unref.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)to_unref.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar5) break;
      this_01 = to_unref.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar5];
      iVar1 = this_01->refs;
      this_01->refs = iVar1 + -1;
      if (iVar1 < 2) {
        FileMetaData::~FileMetaData(this_01);
        operator_delete(this_01,0x58);
      }
      uVar5 = uVar5 + 1;
    }
    std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
    ~_Vector_base(&to_unref.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 );
  }
  Version::Unref(this->base_);
  lVar4 = 0x160;
  do {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)((long)this->levels_ + lVar4 + -0x10));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }